

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O0

cmCMakePath * __thiscall
cmCMakePath::GetWideExtension(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *__str;
  string_view local_88;
  long local_78;
  size_type pos;
  path local_60;
  undefined1 local_38 [8];
  string file;
  cmCMakePath *this_local;
  
  file.field_2._8_8_ = this;
  std::filesystem::__cxx11::path::filename(&local_60,&this->Path);
  std::filesystem::__cxx11::path::string((string *)local_38,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  uVar2 = std::__cxx11::string::empty();
  if ((((uVar2 & 1) != 0) ||
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38,"."), bVar1)) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,".."), bVar1)) {
    memset(__return_storage_ptr__,0,0x28);
    cmCMakePath(__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::operator[]((ulong)local_38);
    local_78 = std::__cxx11::string::find((char)local_38,0x2e);
    if (local_78 == -1) {
      memset(__return_storage_ptr__,0,0x28);
      cmCMakePath(__return_storage_ptr__);
    }
    else {
      lVar3 = std::__cxx11::string::data();
      __str = (char *)(lVar3 + local_78);
      lVar3 = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_88,__str,lVar3 - local_78);
      cmCMakePath(__return_storage_ptr__,local_88,generic_format);
    }
  }
  pos._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::GetWideExtension() const
{
  auto file = this->Path.filename().string();
  if (file.empty() || file == "." || file == "..") {
    return cmCMakePath{};
  }

  auto pos = file.find('.', file[0] == '.' ? 1 : 0);
  if (pos != std::string::npos) {
    return cm::string_view(file.data() + pos, file.length() - pos);
  }

  return cmCMakePath{};
}